

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadSkeleton(OgreXmlSerializer *this,Skeleton *skeleton)

{
  bool bVar1;
  string *__lhs;
  DeadlyImportError *this_00;
  Logger *this_01;
  bool local_c2;
  string local_a8;
  string local_88;
  undefined1 local_65;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Skeleton *local_18;
  Skeleton *skeleton_local;
  OgreXmlSerializer *this_local;
  
  local_18 = skeleton;
  skeleton_local = (Skeleton *)this;
  __lhs = NextNode_abi_cxx11_(this);
  bVar1 = std::operator!=(__lhs,nnSkeleton);
  if (!bVar1) {
    this_01 = DefaultLogger::get();
    Logger::debug(this_01,"Reading Skeleton");
    bVar1 = HasAttribute(this,"blendmode");
    if (bVar1) {
      ReadAttribute<std::__cxx11::string>(&local_a8,this,"blendmode");
      ToLower(&local_88,&local_a8);
      bVar1 = std::operator==(&local_88,"cumulative");
      local_18->blendMode = (uint)bVar1;
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    NextNode_abi_cxx11_(this);
    while( true ) {
      bVar1 = std::operator==(&this->m_currentNodeName,nnBones);
      local_c2 = true;
      if (!bVar1) {
        bVar1 = std::operator==(&this->m_currentNodeName,nnBoneHierarchy);
        local_c2 = true;
        if (!bVar1) {
          bVar1 = std::operator==(&this->m_currentNodeName,nnAnimations);
          local_c2 = true;
          if (!bVar1) {
            local_c2 = std::operator==(&this->m_currentNodeName,nnAnimationLinks);
          }
        }
      }
      if (local_c2 == false) break;
      bVar1 = std::operator==(&this->m_currentNodeName,nnBones);
      if (bVar1) {
        ReadBones(this,local_18);
      }
      else {
        bVar1 = std::operator==(&this->m_currentNodeName,nnBoneHierarchy);
        if (bVar1) {
          ReadBoneHierarchy(this,local_18);
        }
        else {
          bVar1 = std::operator==(&this->m_currentNodeName,nnAnimations);
          if (bVar1) {
            ReadAnimations(this,local_18);
          }
          else {
            SkipCurrentNode_abi_cxx11_(this);
          }
        }
      }
    }
    return;
  }
  local_65 = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_58,"Root node is <",&this->m_currentNodeName);
  std::operator+(&local_38,&local_58,"> expecting <skeleton>");
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  local_65 = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void OgreXmlSerializer::ReadSkeleton(Skeleton *skeleton)
{
    if (NextNode() != nnSkeleton) {
        throw DeadlyImportError("Root node is <" + m_currentNodeName + "> expecting <skeleton>");
    }

    ASSIMP_LOG_DEBUG("Reading Skeleton");

    // Optional blend mode from root node
    if (HasAttribute("blendmode")) {
        skeleton->blendMode = (ToLower(ReadAttribute<std::string>("blendmode")) == "cumulative"
            ? Skeleton::ANIMBLEND_CUMULATIVE : Skeleton::ANIMBLEND_AVERAGE);
    }

    NextNode();

    // Root level nodes
    while(m_currentNodeName == nnBones         ||
          m_currentNodeName == nnBoneHierarchy ||
          m_currentNodeName == nnAnimations    ||
          m_currentNodeName == nnAnimationLinks)
    {
        if (m_currentNodeName == nnBones)
            ReadBones(skeleton);
        else if (m_currentNodeName == nnBoneHierarchy)
            ReadBoneHierarchy(skeleton);
        else if (m_currentNodeName == nnAnimations)
            ReadAnimations(skeleton);
        else
            SkipCurrentNode();
    }
}